

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_emit.hpp
# Opt level: O0

void pstore::exchange::export_ns::emit_string<char_const*>(ostream_base *os,char *first,char *last)

{
  char *os_00;
  ostream_base *os_01;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_50;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_40;
  char *local_28;
  char *pos;
  char *last_local;
  char *first_local;
  ostream_base *os_local;
  
  pos = last;
  last_local = first;
  first_local = (char *)os;
  operator<<(os,'\"');
  local_28 = last_local;
  while( true ) {
    local_28 = std::
               find_if<char_const*,pstore::exchange::export_ns::emit_string<char_const*>(pstore::exchange::export_ns::ostream_base&,char_const*,char_const*)::_lambda(char)_1_>
                         (last_local,pos);
    os_00 = first_local;
    if (local_28 == pos) break;
    local_40 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
               gsl::make_span<char_const>(last_local,(long)local_28 - (long)last_local);
    details::write_span<char_const,_1l>((ostream_base *)os_00,(span<const_char,__1L> *)&local_40);
    os_01 = operator<<((ostream_base *)first_local,'\\');
    operator<<(os_01,*local_28);
    last_local = local_28 + 1;
  }
  if (last_local != pos) {
    local_50 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
               gsl::make_span<char_const>(last_local,(long)pos - (long)last_local);
    details::write_span<char_const,_1l>((ostream_base *)os_00,(span<const_char,__1L> *)&local_50);
  }
  operator<<((ostream_base *)first_local,'\"');
  return;
}

Assistant:

void emit_string (ostream_base & os, Iterator first, Iterator last) {
                os << '"';
                auto pos = first;
                while ((pos = std::find_if (first, last, [] (char const c) {
                            return c == '"' || c == '\\';
                        })) != last) {
                    details::write_span (os, gsl::make_span (&*first, pos - first));
                    os << '\\' << *pos;
                    first = pos + 1;
                }
                if (first != last) {
                    details::write_span (os, gsl::make_span (&*first, last - first));
                }
                os << '"';
            }